

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGatherCubeCase::generateIterations
          (TextureGatherCubeCase *this)

{
  GatherType gatherType;
  int iVar1;
  CubeFace CVar2;
  bool bVar3;
  size_type sVar4;
  const_reference pvVar5;
  reference pvVar6;
  Iteration local_a8;
  int local_78;
  int basicNdx_1;
  Iteration local_68;
  int local_3c;
  CubeFace local_38;
  int basicNdx;
  CubeFace cubeFace;
  int cubeFaceI;
  undefined1 local_28 [8];
  vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  basicIterations;
  TextureGatherCubeCase *this_local;
  
  gatherType = (this->super_TextureGatherCase).m_gatherType;
  basicIterations.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  TextureGatherCase::getOffsetRange((TextureGatherCase *)&cubeFace);
  generateBasic2DCaseIterations
            ((vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
              *)local_28,gatherType,&(this->super_TextureGatherCase).m_textureFormat,
             (IVec2 *)&cubeFace);
  basicNdx = 0;
  do {
    if (5 < basicNdx) {
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
      ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                 *)local_28);
      return;
    }
    local_38 = basicNdx;
    if (basicNdx == 0) {
      for (local_3c = 0; iVar1 = local_3c,
          sVar4 = std::
                  vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                  ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                          *)local_28), iVar1 < (int)sVar4; local_3c = local_3c + 1) {
        local_68.gatherArgs.offsets[1].m_data[1] = 0;
        local_68.gatherArgs.offsets[2].m_data[0] = 0;
        local_68.gatherArgs.offsets[2].m_data[1] = 0;
        local_68.gatherArgs.offsets[3].m_data[0] = 0;
        local_68.gatherArgs.componentNdx = 0;
        local_68.gatherArgs.offsets[0].m_data[0] = 0;
        local_68.gatherArgs.offsets[0].m_data[1] = 0;
        local_68.gatherArgs.offsets[1].m_data[0] = 0;
        local_68.gatherArgs.offsets[3].m_data[1] = 0;
        local_68.face = CUBEFACE_NEGATIVE_X;
        Iteration::Iteration(&local_68);
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration>_>
        ::push_back(&this->m_iterations,&local_68);
        pvVar5 = std::
                 vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                 ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                               *)local_28,(long)local_3c);
        pvVar6 = std::
                 vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration>_>
                 ::back(&this->m_iterations);
        memcpy(pvVar6,pvVar5,0x24);
        CVar2 = local_38;
        pvVar6 = std::
                 vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration>_>
                 ::back(&this->m_iterations);
        pvVar6->face = CVar2;
      }
    }
    else {
      for (local_78 = 0; iVar1 = local_78,
          sVar4 = std::
                  vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                  ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                          *)local_28), iVar1 < (int)sVar4; local_78 = local_78 + 1) {
        bVar3 = isDepthFormat(&(this->super_TextureGatherCase).m_textureFormat);
        if ((bVar3) ||
           (pvVar5 = std::
                     vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                     ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                                   *)local_28,(long)local_78), pvVar5->componentNdx == basicNdx % 4)
           ) {
          local_a8.gatherArgs.offsets[1].m_data[1] = 0;
          local_a8.gatherArgs.offsets[2].m_data[0] = 0;
          local_a8.gatherArgs.offsets[2].m_data[1] = 0;
          local_a8.gatherArgs.offsets[3].m_data[0] = 0;
          local_a8.gatherArgs.componentNdx = 0;
          local_a8.gatherArgs.offsets[0].m_data[0] = 0;
          local_a8.gatherArgs.offsets[0].m_data[1] = 0;
          local_a8.gatherArgs.offsets[1].m_data[0] = 0;
          local_a8.gatherArgs.offsets[3].m_data[1] = 0;
          local_a8.face = CUBEFACE_NEGATIVE_X;
          Iteration::Iteration(&local_a8);
          std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration>_>
          ::push_back(&this->m_iterations,&local_a8);
          pvVar5 = std::
                   vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                   ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                                 *)local_28,(long)local_78);
          pvVar6 = std::
                   vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration>_>
                   ::back(&this->m_iterations);
          memcpy(pvVar6,pvVar5,0x24);
          CVar2 = local_38;
          pvVar6 = std::
                   vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration>_>
                   ::back(&this->m_iterations);
          pvVar6->face = CVar2;
          break;
        }
      }
    }
    basicNdx = basicNdx + 1;
  } while( true );
}

Assistant:

void TextureGatherCubeCase::generateIterations (void)
{
	DE_ASSERT(m_iterations.empty());

	const vector<GatherArgs> basicIterations = generateBasic2DCaseIterations(m_gatherType, m_textureFormat, getOffsetRange());

	for (int cubeFaceI = 0; cubeFaceI < tcu::CUBEFACE_LAST; cubeFaceI++)
	{
		const tcu::CubeFace cubeFace = (tcu::CubeFace)cubeFaceI;

		// Don't duplicate all cases for all faces.
		if (cubeFaceI == 0)
		{
			for (int basicNdx = 0; basicNdx < (int)basicIterations.size(); basicNdx++)
			{
				m_iterations.push_back(Iteration());
				m_iterations.back().gatherArgs = basicIterations[basicNdx];
				m_iterations.back().face = cubeFace;
			}
		}
		else
		{
			// For other faces than first, only test one component per face.
			for (int basicNdx = 0; basicNdx < (int)basicIterations.size(); basicNdx++)
			{
				if (isDepthFormat(m_textureFormat) || basicIterations[basicNdx].componentNdx == cubeFaceI % 4)
				{
					m_iterations.push_back(Iteration());
					m_iterations.back().gatherArgs = basicIterations[basicNdx];
					m_iterations.back().face = cubeFace;
					break;
				}
			}
		}
	}
}